

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O2

MockNamedValue * __thiscall
MockNamedValueList::getValueByName(MockNamedValueList *this,SimpleString *name)

{
  MockNamedValueList MVar1;
  bool bVar2;
  SimpleString SStack_38;
  
  while( true ) {
    MVar1.head_ = this->head_;
    if (MVar1.head_ == (MockNamedValueListNode *)0x0) {
      return (MockNamedValue *)0x0;
    }
    (*(MVar1.head_)->data_->_vptr_MockNamedValue[0x17])(&SStack_38);
    bVar2 = operator==(&SStack_38,name);
    SimpleString::~SimpleString(&SStack_38);
    if (bVar2) break;
    this = (MockNamedValueList *)&(MVar1.head_)->next_;
  }
  return (MVar1.head_)->data_;
}

Assistant:

MockNamedValue* MockNamedValueList::getValueByName(const SimpleString& name)
{
    for (MockNamedValueListNode * p = head_; p; p = p->next())
        if (p->getName() == name)
            return p->item();
    return NULLPTR;
}